

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

SearchResult<unsigned_long,_false> __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,std::less<google::protobuf::Edition>,std::allocator<google::protobuf::Edition>,256,false>>
::
linear_search_impl<google::protobuf::Edition,absl::lts_20250127::container_internal::key_compare_adapter<std::less<google::protobuf::Edition>,google::protobuf::Edition>::checked_compare>
          (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,std::less<google::protobuf::Edition>,std::allocator<google::protobuf::Edition>,256,false>>
           *this,Edition *k,size_type s,ulong e,checked_compare *comp)

{
  bool bVar1;
  key_type *lhs;
  checked_compare *comp_local;
  size_type e_local;
  size_type s_local;
  Edition *k_local;
  btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
  *this_local;
  SearchResult<unsigned_long,_false> local_10;
  
  for (e_local = s; e_local < e; e_local = e_local + 1) {
    lhs = btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
          ::key((btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                 *)this,e_local);
    bVar1 = key_compare_adapter<std::less<google::protobuf::Edition>,_google::protobuf::Edition>::
            checked_compare::operator()<google::protobuf::Edition,_google::protobuf::Edition,_0>
                      (comp,lhs,k);
    if (!bVar1) break;
  }
  SearchResult<unsigned_long,_false>::SearchResult(&local_10,e_local);
  return (SearchResult<unsigned_long,_false>)local_10.value;
}

Assistant:

SearchResult<size_type, false> linear_search_impl(
      const K &k, size_type s, const size_type e, const Compare &comp,
      std::false_type /* IsCompareTo */) const {
    while (s < e) {
      if (!comp(key(s), k)) {
        break;
      }
      ++s;
    }
    return SearchResult<size_type, false>{s};
  }